

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkList
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  string *psVar2;
  size_type sVar3;
  char cVar4;
  value_t vVar5;
  json_value jVar6;
  char *pcVar7;
  Status SVar8;
  int iVar9;
  char *pcVar10;
  undefined1 *puVar11;
  Interpreter *pIVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  undefined1 *puVar13;
  char *pcVar14;
  pointer pbVar15;
  _Alloc_hider _Var16;
  bool bVar17;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  StringArray unresolved;
  writer write;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  networks;
  json json;
  Expression retExpr;
  Network nwk;
  string local_358;
  string *local_338;
  string *local_330;
  Interpreter *local_328;
  undefined1 local_320 [8];
  _Alloc_hider local_318;
  char local_308 [16];
  _Alloc_hider local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined1 local_2d8 [32];
  format_string_checker<char> *local_2b8;
  parse_func local_2b0 [1];
  writer local_2a8 [2];
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  local_298;
  pointer local_278;
  undefined1 local_270 [8];
  json_value local_268;
  undefined4 local_260;
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  Expression local_238;
  undefined1 local_218 [8];
  json_value local_210;
  string local_208;
  undefined4 local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  ErrorCode local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined4 local_198;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined4 local_170;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  undefined4 local_148;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  undefined4 local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  Error local_d8;
  string_t local_b0;
  Network local_90;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  persistent_storage::Network::Network(&local_90);
  local_298.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_270[0] = null;
  local_268.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_270);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_270);
  ReParseMultiNetworkSyntax(&local_d8,this,aExpr,&local_238);
  local_320._0_4_ = local_d8.mCode;
  local_328 = this;
  local_318._M_p = local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,local_d8.mMessage._M_dataplus._M_p,
             local_d8.mMessage._M_dataplus._M_p +
             (long)(_Alloc_hider *)local_d8.mMessage._M_string_length);
  local_338 = (string *)&(__return_storage_ptr__->mError).mMessage;
  local_2f0 = 0;
  local_2e8._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_320._0_4_;
  local_2f8._M_p = (pointer)&local_2e8;
  std::__cxx11::string::operator=(local_338,(string *)&local_318);
  local_330 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_2f8);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_p != &local_2e8) {
    operator_delete(local_2f8._M_p);
  }
  if (local_318._M_p != local_308) {
    operator_delete(local_318._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.mMessage._M_dataplus._M_p != &local_d8.mMessage.field_2) {
    operator_delete(local_d8.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_001cead3;
  if ((ulong)((long)(local_328->mContext).mExportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_328->mContext).mExportFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    if (0x20 < (ulong)((long)(local_328->mContext).mImportFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_328->mContext).mImportFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
      pcVar14 = "multiple files not allowed for --import";
      local_2d8._8_8_ = "multiple files not allowed for --import";
      local_2d8._16_8_ = 0x27;
      local_2d8._24_8_ = 0;
      local_2b0[0] = (parse_func)0x0;
      local_2b8 = (format_string_checker<char> *)local_2d8;
      local_2a8[0].handler_ = (format_string_checker<char> *)local_2d8;
      do {
        if (pcVar14 == "") break;
        pcVar10 = pcVar14;
        if (*pcVar14 == '{') {
LAB_001ce9a3:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_2a8,pcVar14,pcVar10);
          pcVar14 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar10,"",(format_string_checker<char> *)local_2d8);
          bVar17 = true;
        }
        else {
          pcVar10 = pcVar14 + 1;
          bVar17 = pcVar10 != "";
          if (bVar17) {
            if (*pcVar10 != '{') {
              pcVar7 = pcVar14 + 2;
              do {
                pcVar10 = pcVar7;
                bVar17 = pcVar10 != "";
                if (pcVar10 == "") goto LAB_001ce99f;
                pcVar7 = pcVar10 + 1;
              } while (*pcVar10 != '{');
            }
            bVar17 = true;
          }
LAB_001ce99f:
          if (bVar17) goto LAB_001ce9a3;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_2a8,pcVar14,"");
          bVar17 = false;
        }
      } while (bVar17);
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_2d8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_358,(v10 *)"multiple files not allowed for --import",
                 (string_view)ZEXT816(0x27),args_01);
      local_148 = 2;
      puVar13 = local_130;
      local_140 = puVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,local_358._M_dataplus._M_p,
                 local_358._M_dataplus._M_p + local_358._M_string_length);
      local_320._0_4_ = local_148;
      local_318._M_p = local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_140,local_140 + local_138);
      local_2f0 = 0;
      local_2e8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_320._0_4_;
      local_2f8._M_p = (pointer)&local_2e8;
      std::__cxx11::string::operator=(local_338,(string *)&local_318);
      std::__cxx11::string::operator=(local_330,(string *)&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_p != &local_2e8) {
        operator_delete(local_2f8._M_p);
      }
      puVar11 = local_140;
      if (local_318._M_p != local_308) {
        operator_delete(local_318._M_p);
        puVar11 = local_140;
      }
      goto LAB_001ceab6;
    }
    pbVar15 = (local_328->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_278 = (local_328->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if ((local_278 != pbVar15) &&
       ((local_328->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_328->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
      pcVar14 = "--nwk and --dom are mutually exclusive";
      local_2d8._8_8_ = "--nwk and --dom are mutually exclusive";
      local_2d8._16_8_ = 0x26;
      local_2d8._24_8_ = 0;
      local_2b0[0] = (parse_func)0x0;
      local_2b8 = (format_string_checker<char> *)local_2d8;
      local_2a8[0].handler_ = (format_string_checker<char> *)local_2d8;
      do {
        if (pcVar14 == "") break;
        pcVar10 = pcVar14;
        if (*pcVar14 == '{') {
LAB_001ce66f:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_2a8,pcVar14,pcVar10);
          pcVar14 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar10,"",(format_string_checker<char> *)local_2d8);
          bVar17 = true;
        }
        else {
          pcVar10 = pcVar14 + 1;
          bVar17 = pcVar10 != "";
          if (bVar17) {
            if (*pcVar10 != '{') {
              pcVar7 = pcVar14 + 2;
              do {
                pcVar10 = pcVar7;
                bVar17 = pcVar10 != "";
                if (pcVar10 == "") goto LAB_001ce66b;
                pcVar7 = pcVar10 + 1;
              } while (*pcVar10 != '{');
            }
            bVar17 = true;
          }
LAB_001ce66b:
          if (bVar17) goto LAB_001ce66f;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_2a8,pcVar14,"");
          bVar17 = false;
        }
      } while (bVar17);
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_2d8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_358,(v10 *)"--nwk and --dom are mutually exclusive",
                 (string_view)ZEXT816(0x26),args);
      local_170 = 2;
      puVar13 = local_158;
      local_168 = puVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,local_358._M_dataplus._M_p,
                 local_358._M_dataplus._M_p + local_358._M_string_length);
      local_320._0_4_ = local_170;
      local_318._M_p = local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_168,local_168 + local_160);
      local_2f0 = 0;
      local_2e8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_320._0_4_;
      local_2f8._M_p = (pointer)&local_2e8;
      std::__cxx11::string::operator=(local_338,(string *)&local_318);
      std::__cxx11::string::operator=(local_330,(string *)&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_p != &local_2e8) {
        operator_delete(local_2f8._M_p);
      }
      puVar11 = local_168;
      if (local_318._M_p != local_308) {
        operator_delete(local_318._M_p);
        puVar11 = local_168;
      }
      goto LAB_001ceab6;
    }
    psVar2 = (local_328->mContext).mDomAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((local_328->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar2) {
      if (local_278 == pbVar15) {
        SVar8 = persistent_storage::Registry::GetAllNetworks
                          ((local_328->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&local_298);
        if (kNotFound < SVar8) {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_05.field_1.args_ = in_R9.args_;
          args_05.desc_ = (unsigned_long_long)&local_358;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2d8,(v10 *)"Failed to find registry entity of type: network",
                     (string_view)ZEXT816(0x2f),args_05);
          local_1c0 = kNotFound;
          local_1b8 = local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_2d8._0_8_,
                     (char *)(local_2d8._8_8_ + local_2d8._0_8_));
          local_320._0_4_ = local_1c0;
          local_318._M_p = local_308;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,local_1b8,local_1b8 + local_1b0);
          local_2f8._M_p = (pointer)&local_2e8;
          local_2f0 = 0;
          local_2e8._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_320);
          Value::~Value((Value *)local_320);
          if (local_1b8 != local_1a8) {
            operator_delete(local_1b8);
          }
          if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_);
          }
        }
      }
      else {
        pIVar12 = local_328;
        do {
          iVar9 = std::__cxx11::string::compare((char *)pbVar15);
          if (((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)pbVar15), iVar9 == 0))
             && ((long)(pIVar12->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pIVar12->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
            local_2d8._0_4_ = string_type;
            pcVar14 = "\'{}\' must not combine with any other network alias";
            local_2d8._8_8_ = "\'{}\' must not combine with any other network alias";
            local_2d8._16_8_ = 0x32;
            local_2d8._24_8_ = 0x100000000;
            local_2b0[0] = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_2b8 = (format_string_checker<char> *)local_2d8;
            local_2a8[0].handler_ = (format_string_checker<char> *)local_2d8;
            do {
              if (pcVar14 == "") break;
              pcVar10 = pcVar14;
              if (*pcVar14 == '{') {
LAB_001cee2c:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)local_2a8,pcVar14,pcVar10);
                pcVar14 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                    (pcVar10,"",(format_string_checker<char> *)local_2d8);
                bVar17 = true;
              }
              else {
                pcVar10 = pcVar14 + 1;
                bVar17 = pcVar10 != "";
                if (bVar17) {
                  if (*pcVar10 != '{') {
                    pcVar7 = pcVar14 + 2;
                    do {
                      pcVar10 = pcVar7;
                      bVar17 = pcVar10 != "";
                      if (pcVar10 == "") goto LAB_001cee28;
                      pcVar7 = pcVar10 + 1;
                    } while (*pcVar10 != '{');
                  }
                  bVar17 = true;
                }
LAB_001cee28:
                if (bVar17) goto LAB_001cee2c;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)local_2a8,pcVar14,"");
                bVar17 = false;
              }
            } while (bVar17);
            local_2d8._0_8_ = (pbVar15->_M_dataplus)._M_p;
            local_2d8._8_8_ = pbVar15->_M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x32;
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)local_2d8;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_358,(v10 *)"\'{}\' must not combine with any other network alias",
                       fmt_00,args_03);
            local_260 = 2;
            local_258 = local_248;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_258,local_358._M_dataplus._M_p,
                       local_358._M_dataplus._M_p + local_358._M_string_length);
            local_320._0_4_ = local_260;
            local_318._M_p = local_308;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_318,local_258,local_258 + local_250);
            local_2f0 = 0;
            local_2e8._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_320._0_4_;
            local_2f8._M_p = (pointer)&local_2e8;
            std::__cxx11::string::operator=(local_338,(string *)&local_318);
            std::__cxx11::string::operator=(local_330,(string *)&local_2f8);
            pIVar12 = local_328;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_p != &local_2e8) {
              operator_delete(local_2f8._M_p);
            }
            if (local_318._M_p != local_308) {
              operator_delete(local_318._M_p);
            }
            if (local_258 != local_248) {
              operator_delete(local_258);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p);
            }
            iVar9 = 4;
            bVar17 = false;
          }
          else {
            iVar9 = 0;
            bVar17 = true;
          }
          if (!bVar17) goto LAB_001cefb0;
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != local_278);
        iVar9 = 0xd;
LAB_001cefb0:
        if (iVar9 == 4) goto LAB_001cead3;
        if (iVar9 != 0xd) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_270);
          std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::~vector(&local_298);
          persistent_storage::Network::~Network(&local_90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_238);
          Value::~Value(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        local_358._M_dataplus._M_p = (pointer)0x0;
        local_358._M_string_length = 0;
        local_358.field_2._M_allocated_capacity = 0;
        SVar8 = persistent_storage::Registry::GetNetworksByAliases
                          ((local_328->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(StringArray *)local_328,&local_298,(StringArray *)&local_358);
        sVar3 = local_358._M_string_length;
        local_328 = (Interpreter *)CONCAT71(local_328._1_7_,SVar8);
        if (local_358._M_dataplus._M_p != (pointer)local_358._M_string_length) {
          _Var16._M_p = local_358._M_dataplus._M_p;
          do {
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,*(long *)_Var16._M_p,
                       *(long *)((long)_Var16._M_p + 8) + *(long *)_Var16._M_p);
            pIVar12 = (Interpreter *)local_f8;
            local_f8._0_8_ = (pointer)(local_f8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"failed to resolve","");
            PrintNetworkMessage(pIVar12,&local_208,(string *)local_f8,kYellow);
            if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
            _Var16._M_p = _Var16._M_p + 0x20;
          } while (_Var16._M_p != (pointer)sVar3);
        }
        cVar4 = (char)local_328;
        if ((char)local_328 == '\0') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_358);
        }
        else {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_04.field_1.args_ = in_R9.args_;
          args_04.desc_ = (unsigned_long_long)local_2a8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2d8,(v10 *)"Failed to find registry entity of type: network",
                     (string_view)ZEXT816(0x2f),args_04);
          local_1e8 = 5;
          local_1e0 = local_1d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e0,local_2d8._0_8_,
                     (char *)(local_2d8._8_8_ + local_2d8._0_8_));
          local_320._0_4_ = local_1e8;
          local_318._M_p = local_308;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,local_1e0,local_1e0 + local_1d8);
          local_2f8._M_p = (pointer)&local_2e8;
          local_2f0 = 0;
          local_2e8._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_320);
          Value::~Value((Value *)local_320);
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0);
          }
          if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_358);
          if (cVar4 != '\0') goto LAB_001cead3;
        }
      }
    }
    else {
      SVar8 = persistent_storage::Registry::GetNetworksInDomain
                        ((local_328->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,psVar2,&local_298);
      if (SVar8 != kSuccess) {
        local_2d8._0_4_ = string_type;
        pcVar14 = "failed to find networks in domain \'{}\'";
        local_2d8._8_8_ = "failed to find networks in domain \'{}\'";
        local_2d8._16_8_ = 0x26;
        local_2d8._24_8_ = 0x100000000;
        local_2b0[0] = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_2b8 = (format_string_checker<char> *)local_2d8;
        local_2a8[0].handler_ = (format_string_checker<char> *)local_2d8;
        do {
          if (pcVar14 == "") break;
          pcVar10 = pcVar14;
          if (*pcVar14 == '{') {
LAB_001cec12:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_2a8,pcVar14,pcVar10);
            pcVar14 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar10,"",(format_string_checker<char> *)local_2d8);
            bVar17 = true;
          }
          else {
            pcVar10 = pcVar14 + 1;
            bVar17 = pcVar10 != "";
            if (bVar17) {
              if (*pcVar10 != '{') {
                pcVar7 = pcVar14 + 2;
                do {
                  pcVar10 = pcVar7;
                  bVar17 = pcVar10 != "";
                  if (pcVar10 == "") goto LAB_001cec0e;
                  pcVar7 = pcVar10 + 1;
                } while (*pcVar10 != '{');
              }
              bVar17 = true;
            }
LAB_001cec0e:
            if (bVar17) goto LAB_001cec12;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_2a8,pcVar14,"");
            bVar17 = false;
          }
        } while (bVar17);
        pbVar15 = (local_328->mContext).mDomAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_2d8._0_8_ = (pbVar15->_M_dataplus)._M_p;
        local_2d8._8_8_ = pbVar15->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x26;
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)local_2d8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_358,(v10 *)"failed to find networks in domain \'{}\'",fmt,args_02);
        local_198 = 5;
        puVar13 = local_180;
        local_190 = puVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_358._M_dataplus._M_p,
                   local_358._M_dataplus._M_p + local_358._M_string_length);
        local_320._0_4_ = local_198;
        local_318._M_p = local_308;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_318,local_190,local_190 + local_188);
        local_2f0 = 0;
        local_2e8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_320._0_4_;
        local_2f8._M_p = (pointer)&local_2e8;
        std::__cxx11::string::operator=(local_338,(string *)&local_318);
        std::__cxx11::string::operator=(local_330,(string *)&local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_p != &local_2e8) {
          operator_delete(local_2f8._M_p);
        }
        puVar11 = local_190;
        if (local_318._M_p != local_308) {
          operator_delete(local_318._M_p);
          puVar11 = local_190;
        }
        goto LAB_001ceab6;
      }
    }
    local_210.object = (object_t *)0x0;
    local_218[0] = array;
    local_320 = (undefined1  [8])
                local_298.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_2d8._0_8_ =
         local_298.
         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_210.object =
         (object_t *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::
         create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>>
                   ((__normal_iterator<const_ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                     *)local_320,
                    (__normal_iterator<const_ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                     *)local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_218);
    jVar6 = local_268;
    vVar5 = local_270[0];
    local_270[0] = local_218[0];
    local_218[0] = vVar5;
    local_268.string = local_210.string;
    local_210 = jVar6;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_270);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_218);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_218 + 8),local_218[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_b0,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_270,4,' ',false,strict);
    Value::Value((Value *)local_320,&local_b0);
    (__return_storage_ptr__->mError).mCode = local_320._0_4_;
    std::__cxx11::string::operator=(local_338,(string *)&local_318);
    std::__cxx11::string::operator=(local_330,(string *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p);
    }
    if (local_318._M_p != local_308) {
      operator_delete(local_318._M_p);
    }
    psVar2 = &local_b0;
  }
  else {
    local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
    pcVar14 = "multiple files not allowed for --export";
    local_2d8._8_8_ = "multiple files not allowed for --export";
    local_2d8._16_8_ = 0x27;
    local_2d8._24_8_ = 0;
    local_2b0[0] = (parse_func)0x0;
    local_2b8 = (format_string_checker<char> *)local_2d8;
    local_2a8[0].handler_ = (format_string_checker<char> *)local_2d8;
    do {
      if (pcVar14 == "") break;
      pcVar10 = pcVar14;
      if (*pcVar14 == '{') {
LAB_001ce809:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_2a8,pcVar14,pcVar10);
        pcVar14 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar10,"",(format_string_checker<char> *)local_2d8);
        bVar17 = true;
      }
      else {
        pcVar10 = pcVar14 + 1;
        bVar17 = pcVar10 != "";
        if (bVar17) {
          if (*pcVar10 != '{') {
            pcVar7 = pcVar14 + 2;
            do {
              pcVar10 = pcVar7;
              bVar17 = pcVar10 != "";
              if (pcVar10 == "") goto LAB_001ce805;
              pcVar7 = pcVar10 + 1;
            } while (*pcVar10 != '{');
          }
          bVar17 = true;
        }
LAB_001ce805:
        if (bVar17) goto LAB_001ce809;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_2a8,pcVar14,"");
        bVar17 = false;
      }
    } while (bVar17);
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_2d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_358,(v10 *)"multiple files not allowed for --export",
               (string_view)ZEXT816(0x27),args_00);
    local_120 = 2;
    puVar13 = local_108;
    local_118 = puVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_358._M_dataplus._M_p,
               local_358._M_dataplus._M_p + local_358._M_string_length);
    local_320._0_4_ = local_120;
    local_318._M_p = local_308;
    std::__cxx11::string::_M_construct<char*>((string *)&local_318,local_118,local_118 + local_110);
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_320._0_4_;
    local_2f8._M_p = (pointer)&local_2e8;
    std::__cxx11::string::operator=(local_338,(string *)&local_318);
    std::__cxx11::string::operator=(local_330,(string *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p);
    }
    puVar11 = local_118;
    if (local_318._M_p != local_308) {
      operator_delete(local_318._M_p);
      puVar11 = local_118;
    }
LAB_001ceab6:
    if (puVar11 != puVar13) {
      operator_delete(puVar11);
    }
    psVar2 = &local_358;
  }
  puVar13 = (undefined1 *)(&(psVar2->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13 != &psVar2->field_2) {
    operator_delete(puVar13);
  }
LAB_001cead3:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_270);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_270 + 8),local_270[0]);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
    operator_delete(local_90.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
    operator_delete(local_90.mName._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkList(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Interpreter::Value   value;
    Expression           retExpr;
    Network              nwk{};
    std::vector<Network> networks;
    ::nlohmann::json     json;

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));
    // network and domain must not be specified simultaneously
    VerifyOrExit(mContext.mNwkAliases.size() == 0 || mContext.mDomAliases.size() == 0,
                 value = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));

    if (mContext.mDomAliases.size() > 0)
    {
        VerifyOrExit(mRegistry->GetNetworksInDomain(mContext.mDomAliases[0], networks) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("failed to find networks in domain '{}'", mContext.mDomAliases[0]));
    }
    else if (mContext.mNwkAliases.size() == 0)
    {
        RegistryStatus status = mRegistry->GetAllNetworks(networks);
        if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
        {
            value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR);
        }
    }
    else
    {
        // Quickly check group aliases
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
                VerifyOrExit(mContext.mNwkAliases.size() == 1, value = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
        }

        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
        for (const auto &alias : unresolved)
        {
            PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR));
    }

    json  = networks;
    value = json.dump(JSON_INDENT_DEFAULT);

exit:
    return value;
}